

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

v_array<COST_SENSITIVE::label> * Search::read_allowed_transitions(action A,char *filename)

{
  FILE *__stream;
  string *pmessage;
  ostream *poVar1;
  int *piVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *in_RDX;
  uint in_ESI;
  v_array<COST_SENSITIVE::label> *in_RDI;
  label ld;
  wclass c;
  size_t to_1;
  v_array<COST_SENSITIVE::wclass> costs;
  size_t from_1;
  int count;
  int to;
  int from;
  int rd;
  bool *bg;
  stringstream __msg;
  FILE *f;
  wclass *in_stack_fffffffffffffd78;
  v_array<COST_SENSITIVE::wclass> *in_stack_fffffffffffffd80;
  int plineNumber;
  v_array<COST_SENSITIVE::label> *pfile;
  vw_exception *in_stack_fffffffffffffdb0;
  ulong local_220;
  ulong local_1f8;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  bool *local_1e0;
  undefined1 local_1d1;
  stringstream local_1a0 [16];
  stringstream local_190 [216];
  size_t in_stack_ffffffffffffff48;
  
  pfile = in_RDI;
  __stream = fopen64(in_RDX,"r");
  plineNumber = (int)((ulong)in_RDI >> 0x20);
  if (__stream == (FILE *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    pmessage = (string *)
               std::operator<<((ostream *)(local_1a0 + 0x10),"error: could not read file ");
    poVar1 = std::operator<<((ostream *)pmessage,in_RDX);
    poVar1 = std::operator<<(poVar1," (");
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    poVar1 = std::operator<<(poVar1,pcVar3);
    std::operator<<(poVar1,"); assuming all transitions are valid");
    local_1d1 = 1;
    uVar4 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception(in_stack_fffffffffffffdb0,(char *)pfile,plineNumber,pmessage);
    local_1d1 = 0;
    __cxa_throw(uVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_1e0 = calloc_or_throw<bool>(in_stack_ffffffffffffff48);
  local_1f0 = 0;
  while( true ) {
    local_1e4 = __isoc99_fscanf(__stream,"%d:%d",&local_1e8,&local_1ec);
    if (local_1e4 < 1) break;
    if ((local_1e8 < 0) || ((int)in_ESI < local_1e8)) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"warning: ignoring transition from ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1e8);
      poVar1 = std::operator<<(poVar1," because it\'s out of the range [0,");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
      poVar1 = std::operator<<(poVar1,"]");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    if ((local_1ec < 0) || ((int)in_ESI < local_1ec)) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"warning: ignoring transition to ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ec);
      poVar1 = std::operator<<(poVar1," because it\'s out of the range [0,");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
      poVar1 = std::operator<<(poVar1,"]");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    local_1e0[local_1e8 * (in_ESI + 1) + local_1ec] = true;
    local_1f0 = local_1f0 + 1;
  }
  fclose(__stream);
  v_init<COST_SENSITIVE::label>();
  for (local_1f8 = 0; local_1f8 < in_ESI; local_1f8 = local_1f8 + 1) {
    v_init<COST_SENSITIVE::wclass>();
    for (local_220 = 0; local_220 < in_ESI; local_220 = local_220 + 1) {
      if ((local_1e0[local_1f8 * (in_ESI + 1) + local_220] & 1U) != 0) {
        v_array<COST_SENSITIVE::wclass>::push_back
                  (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      }
    }
    v_array<COST_SENSITIVE::label>::push_back
              ((v_array<COST_SENSITIVE::label> *)in_stack_fffffffffffffd80,
               (label *)in_stack_fffffffffffffd78);
  }
  free(local_1e0);
  poVar1 = std::operator<<((ostream *)&std::cerr,"read ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1f0);
  poVar1 = std::operator<<(poVar1," allowed transitions from ");
  poVar1 = std::operator<<(poVar1,in_RDX);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return pfile;
}

Assistant:

v_array<CS::label> read_allowed_transitions(action A, const char* filename)
{
  FILE* f = fopen(filename, "r");
  if (f == nullptr)
    THROW("error: could not read file " << filename << " (" << strerror(errno)
                                        << "); assuming all transitions are valid");

  bool* bg = calloc_or_throw<bool>(((size_t)(A + 1)) * (A + 1));
  int rd, from, to, count = 0;
  while ((rd = fscanf(f, "%d:%d", &from, &to)) > 0)
  {
    if ((from < 0) || (from > (int)A))
    {
      std::cerr << "warning: ignoring transition from " << from << " because it's out of the range [0," << A << "]"
                << endl;
    }
    if ((to < 0) || (to > (int)A))
    {
      std::cerr << "warning: ignoring transition to " << to << " because it's out of the range [0," << A << "]" << endl;
    }
    bg[from * (A + 1) + to] = true;
    count++;
  }
  fclose(f);

  v_array<CS::label> allowed = v_init<CS::label>();

  for (size_t from = 0; from < A; from++)
  {
    v_array<CS::wclass> costs = v_init<CS::wclass>();

    for (size_t to = 0; to < A; to++)
      if (bg[from * (A + 1) + to])
      {
        CS::wclass c = {FLT_MAX, (action)to, 0., 0.};
        costs.push_back(c);
      }

    CS::label ld = {costs};
    allowed.push_back(ld);
  }
  free(bg);

  std::cerr << "read " << count << " allowed transitions from " << filename << endl;

  return allowed;
}